

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::create_look_ups(jpeg_decoder *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = 0x2c8d00;
  iVar3 = 0x5b6900;
  iVar4 = -0xe25100;
  iVar5 = -0xb2f480;
  for (lVar1 = -0x400; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(int *)((long)this->m_cbb + lVar1) = iVar5 >> 0x10;
    *(int *)((long)this->m_crg + lVar1) = iVar4 >> 0x10;
    *(int *)((long)this->m_cbg + lVar1) = iVar3;
    *(int *)((long)&this->m_pScan_line_0 + lVar1) = iVar2;
    iVar2 = iVar2 + -0x581a;
    iVar3 = iVar3 + -0xb6d2;
    iVar4 = iVar4 + 0x1c5a2;
    iVar5 = iVar5 + 0x166e9;
  }
  return;
}

Assistant:

void jpeg_decoder::create_look_ups()
	{
		for (int i = 0; i <= 255; i++)
		{
			int k = i - 128;
			m_crr[i] = (FIX(1.40200f) * k + ONE_HALF) >> SCALEBITS;
			m_cbb[i] = (FIX(1.77200f) * k + ONE_HALF) >> SCALEBITS;
			m_crg[i] = (-FIX(0.71414f)) * k;
			m_cbg[i] = (-FIX(0.34414f)) * k + ONE_HALF;
		}
	}